

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O2

void __thiscall cmStringReplaceHelper::ParseReplaceExpression(cmStringReplaceHelper *this)

{
  string *psVar1;
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  *this_00;
  byte bVar2;
  ulong uVar3;
  ostream *poVar4;
  size_type sVar5;
  char (*__args) [2];
  string asStack_1c8 [32];
  ostringstream error;
  
  psVar1 = &this->ReplaceExpression;
  this_00 = &this->Replacements;
  sVar5 = 0;
  while( true ) {
    while( true ) {
      if ((this->ReplaceExpression)._M_string_length <= sVar5) {
        return;
      }
      uVar3 = std::__cxx11::string::find((char)psVar1,0x5c);
      if (uVar3 != 0xffffffffffffffff) break;
      sVar5 = (this->ReplaceExpression)._M_string_length;
      std::__cxx11::string::substr((ulong)&error,(ulong)psVar1);
      std::
      vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
      ::emplace_back<std::__cxx11::string>
                ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error);
      std::__cxx11::string::~string((string *)&error);
    }
    if (uVar3 != sVar5) {
      std::__cxx11::string::substr((ulong)&error,(ulong)psVar1);
      std::
      vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
      ::emplace_back<std::__cxx11::string>
                ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error);
      std::__cxx11::string::~string((string *)&error);
    }
    if (uVar3 == (this->ReplaceExpression)._M_string_length - 1) {
      this->ValidReplaceExpression = false;
      std::__cxx11::string::assign((char *)this);
      return;
    }
    bVar2 = (psVar1->_M_dataplus)._M_p[uVar3 + 1];
    if ((char)bVar2 < 0x30) break;
    if (bVar2 < 0x3a) {
      _error = (char)bVar2 + -0x30;
      std::
      vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
      ::emplace_back<int>(this_00,(int *)&error);
    }
    else {
      if (bVar2 == 0x5c) {
        __args = (char (*) [2])0x646fa9;
      }
      else {
        if (bVar2 != 0x6e) break;
        __args = (char (*) [2])0x64a205;
      }
      std::
      vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
      ::emplace_back<char_const(&)[2]>
                ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                  *)this_00,__args);
    }
    sVar5 = uVar3 + 2;
  }
  this->ValidReplaceExpression = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar4 = std::operator<<((ostream *)&error,"Unknown escape \"");
  std::__cxx11::string::substr((ulong)asStack_1c8,(ulong)psVar1);
  poVar4 = std::operator<<(poVar4,asStack_1c8);
  std::operator<<(poVar4,"\" in replace-expression");
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,asStack_1c8);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return;
}

Assistant:

void cmStringReplaceHelper::ParseReplaceExpression()
{
  std::string::size_type l = 0;
  while (l < this->ReplaceExpression.length()) {
    auto r = this->ReplaceExpression.find('\\', l);
    if (r == std::string::npos) {
      r = this->ReplaceExpression.length();
      this->Replacements.emplace_back(
        this->ReplaceExpression.substr(l, r - l));
    } else {
      if (r - l > 0) {
        this->Replacements.emplace_back(
          this->ReplaceExpression.substr(l, r - l));
      }
      if (r == (this->ReplaceExpression.length() - 1)) {
        this->ValidReplaceExpression = false;
        this->ErrorString = "replace-expression ends in a backslash";
        return;
      }
      if ((this->ReplaceExpression[r + 1] >= '0') &&
          (this->ReplaceExpression[r + 1] <= '9')) {
        this->Replacements.emplace_back(this->ReplaceExpression[r + 1] - '0');
      } else if (this->ReplaceExpression[r + 1] == 'n') {
        this->Replacements.emplace_back("\n");
      } else if (this->ReplaceExpression[r + 1] == '\\') {
        this->Replacements.emplace_back("\\");
      } else {
        this->ValidReplaceExpression = false;
        std::ostringstream error;
        error << "Unknown escape \"" << this->ReplaceExpression.substr(r, 2)
              << "\" in replace-expression";
        this->ErrorString = error.str();
        return;
      }
      r += 2;
    }
    l = r;
  }
}